

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O2

TemplateDecls * __thiscall
pfederc::Parser::parseTemplateDecl(TemplateDecls *__return_storage_ptr__,Parser *this)

{
  undefined1 auVar1 [8];
  _func_int ***ppp_Var2;
  undefined1 auVar3 [8];
  bool bVar4;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  *pvVar5;
  bool bVar6;
  undefined1 local_90 [8];
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> templdecl;
  unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> templdecl_1;
  undefined2 local_5a;
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  local_58;
  undefined4 local_3c;
  
  sanityExpect(this,TOK_OP_TEMPL_BRACKET_OPEN);
  bVar6 = false;
  parseExpression((Parser *)local_90,(Precedence)this);
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while ((local_90 != (undefined1  [8])0x0 &&
         (bVar4 = isBiOpExpr((Expr *)local_90,TOK_OP_COMMA), auVar3 = local_90, bVar4))) {
    if (*(_func_int ***)local_90 != (_func_int **)&PTR__BiOpExpr_00128998) {
      __cxa_bad_cast();
    }
    templdecl._M_t.
    super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>._M_t.
    super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>.
    super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
           *)((long)&((string *)((long)local_90 + 0x38))->field_2 + 8);
    *(undefined8 *)((long)&((string *)((long)local_90 + 0x38))->field_2 + 8) = 0;
    fromExprToTemplateDecl
              ((Parser *)&templdecl_1,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
    if ((__uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>)
        templdecl_1._M_t.
        super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>.
        _M_t.
        super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
        .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>)0x0) {
      bVar6 = true;
    }
    else {
      std::
      vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      ::_M_insert_rval(&local_58,
                       (const_iterator)
                       local_58.
                       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,(value_type *)&templdecl_1);
    }
    auVar1 = *(undefined1 (*) [8])&((string *)((long)auVar3 + 0x38))->field_2;
    (((string *)((long)auVar3 + 0x38))->field_2)._M_allocated_capacity = 0;
    if (local_90 != (undefined1  [8])0x0) {
      ppp_Var2 = (_func_int ***)local_90;
      local_90 = auVar1;
      (*(*ppp_Var2)[1])();
      auVar1 = local_90;
    }
    local_90 = auVar1;
    std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>::~unique_ptr
              (&templdecl_1);
    if ((__uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>)
        templdecl._M_t.
        super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>.
        _M_t.
        super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
        .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>)0x0) {
      (**(code **)(*(long *)templdecl._M_t.
                            super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
                            .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl + 8)
      )();
    }
  }
  fromExprToTemplateDecl
            ((Parser *)&templdecl,
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this);
  if ((__uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>)
      templdecl._M_t.
      super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>._M_t
      .super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>.
      super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>)0x0) {
    bVar6 = true;
  }
  else {
    std::
    vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
    ::_M_insert_rval(&local_58,
                     (const_iterator)
                     local_58.
                     super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&templdecl);
  }
  bVar4 = expect(this,TOK_TEMPL_BRACKET_CLOSE);
  pvVar5 = __return_storage_ptr__;
  if (bVar4) {
    if (!bVar6) {
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_58.
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_58.
           super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar5 = &local_58;
    }
  }
  else {
    local_5a = STX_ERR_EXPECTED_ARR_CLOSING_BRACKET;
    local_3c = 3;
    std::
    make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
              ((Level *)&templdecl_1,(SyntaxErrorCode *)&local_5a,(Position *)&local_3c);
    generateError((Parser *)&stack0xffffffffffffffc8,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               &stack0xffffffffffffffc8);
    std::
    unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)&templdecl_1);
  }
  (pvVar5->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar5->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar5->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>::~unique_ptr
            (&templdecl);
  std::
  vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ::~vector(&local_58);
  if (local_90 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_90)[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

TemplateDecls Parser::parseTemplateDecl() noexcept {
  sanityExpect(TokenType::TOK_OP_TEMPL_BRACKET_OPEN);

  bool err = false;

  std::unique_ptr<Expr> expr(parseExpression());
  TemplateDecls result;

  while (expr && isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr &biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    std::unique_ptr<Expr> rhs(biopexpr.getRightPtr());

    std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(rhs)));
    if (!templdecl)
      err = true;
    else
      // success, push on result
      result.insert(result.begin(), std::move(templdecl));

    // next iterator step
    expr = biopexpr.getLeftPtr();
  }
  
  std::unique_ptr<TemplateDecl> templdecl(fromExprToTemplateDecl(std::move(expr)));
  if (!templdecl)
    err = true;
  // success, push on result
  else
    result.insert(result.begin(), std::move(templdecl));

  if (!expect(TokenType::TOK_TEMPL_BRACKET_CLOSE)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_EXPECTED_TEMPL_CLOSING_BRACKET,
          lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return TemplateDecls();

  return result;
}